

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

MacroActualArgumentListSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseActualArgumentList
          (MacroParser *this,Token prevToken)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  long *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> arguments;
  Token closeParen;
  Token openParen;
  Preprocessor *in_stack_fffffffffffffe60;
  SourceLocation in_stack_fffffffffffffe68;
  MacroParser *in_stack_fffffffffffffe70;
  DiagCode code;
  Token *in_stack_fffffffffffffec8;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_fffffffffffffed0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffed8;
  MacroParser *in_stack_fffffffffffffee0;
  string_view local_48;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_24;
  Token local_18;
  MacroActualArgumentListSyntax *local_8;
  
  bVar1 = peek(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68._6_2_);
  if (bVar1) {
    consume(in_stack_fffffffffffffe70);
    Token::Token((Token *)in_stack_fffffffffffffe60);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x633f94);
    parseArgumentList<slang::parsing::Preprocessor::MacroParser::parseActualArgumentList(slang::parsing::Token)::__0>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffec0,
               *(EVP_PKEY_CTX **)(*in_RDI + 8),src);
    local_8 = BumpAllocator::
              emplace<slang::syntax::MacroActualArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                        ((BumpAllocator *)in_stack_fffffffffffffee0,
                         (Token *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x63402a);
  }
  else {
    local_24 = 0x50004;
    local_38 = Token::location(&local_18);
    local_48 = Token::rawText((Token *)in_stack_fffffffffffffe70);
    code = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_48);
    local_30 = SourceLocation::operator+<unsigned_long>
                         ((SourceLocation *)in_stack_fffffffffffffe68,
                          (unsigned_long)in_stack_fffffffffffffe60);
    Preprocessor::addDiag(in_stack_fffffffffffffe60,code,in_stack_fffffffffffffe68);
    local_8 = (MacroActualArgumentListSyntax *)0x0;
  }
  return local_8;
}

Assistant:

MacroActualArgumentListSyntax* Preprocessor::MacroParser::parseActualArgumentList(Token prevToken) {
    // macro has arguments, so we expect to see them here
    if (!peek(TokenKind::OpenParenthesis)) {
        pp.addDiag(diag::ExpectedMacroArgs, prevToken.location() + prevToken.rawText().length());
        return nullptr;
    }

    auto openParen = consume();
    Token closeParen;
    SmallVector<TokenOrSyntax, 8> arguments;
    parseArgumentList(arguments, [this]() { return parseActualArgument(); }, closeParen);

    return pp.alloc.emplace<MacroActualArgumentListSyntax>(openParen, arguments.copy(pp.alloc),
                                                           closeParen);
}